

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCex.c
# Opt level: O3

Abc_Cex_t * Gia_ManCexExtendToIncludeCurrentStates(Gia_Man_t *p,Abc_Cex_t *pCex)

{
  Gia_Obj_t *pGVar1;
  int *piVar2;
  ulong uVar3;
  bool bVar4;
  Abc_Cex_t *pAVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  Vec_Int_t *pVVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  
  if (pCex->nRegs < 1) {
    __assert_fail("pCex->nRegs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCex.c"
                  ,0x137,
                  "Abc_Cex_t *Gia_ManCexExtendToIncludeCurrentStates(Gia_Man_t *, Abc_Cex_t *)");
  }
  uVar9 = 0;
  pAVar5 = Abc_CexAlloc(0,p->vCis->nSize,pCex->iFrame + 1);
  iVar8 = pCex->iFrame;
  pAVar5->iPo = pCex->iPo;
  pAVar5->iFrame = iVar8;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
  iVar8 = p->nRegs;
  if (0 < iVar8) {
    uVar14 = 0;
    do {
      iVar7 = p->vCos->nSize;
      uVar11 = (iVar7 - iVar8) + uVar14;
      if (((int)uVar11 < 0) || (iVar7 <= (int)uVar11)) goto LAB_006e22e2;
      iVar8 = p->vCos->pArray[uVar11];
      lVar10 = (long)iVar8;
      if ((lVar10 < 0) || (p->nObjs <= iVar8)) goto LAB_006e22c3;
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) {
        uVar9 = (ulong)uVar14;
        break;
      }
      uVar11 = uVar14 + 1;
      uVar9 = (ulong)uVar11;
      *(ulong *)(pGVar1 + lVar10) =
           *(ulong *)(pGVar1 + lVar10) & 0xffffffffbfffffff |
           (ulong)(((uint)(&pCex[1].iPo)[uVar14 >> 5] >> ((byte)uVar14 & 0x1f) & 1) << 0x1e);
      iVar8 = p->nRegs;
      uVar14 = uVar11;
    } while ((int)uVar11 < iVar8);
  }
  iVar8 = (int)uVar9;
  if (iVar8 != pCex->nRegs) {
    __assert_fail("iBit == pCex->nRegs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCex.c"
                  ,0x141,
                  "Abc_Cex_t *Gia_ManCexExtendToIncludeCurrentStates(Gia_Man_t *, Abc_Cex_t *)");
  }
  if (-1 < pCex->iFrame) {
    iVar7 = 0;
    do {
      iVar6 = p->nRegs;
      pVVar12 = p->vCis;
      iVar8 = pVVar12->nSize;
      if (iVar6 < iVar8) {
        lVar10 = 0;
        do {
          if (iVar8 <= lVar10) goto LAB_006e22e2;
          lVar16 = (long)pVVar12->pArray[lVar10];
          if ((lVar16 < 0) || (p->nObjs <= pVVar12->pArray[lVar10])) goto LAB_006e22c3;
          pGVar1 = p->pObjs;
          if (pGVar1 == (Gia_Obj_t *)0x0) break;
          *(ulong *)(pGVar1 + lVar16) =
               *(ulong *)(pGVar1 + lVar16) & 0xffffffffbfffffff |
               (ulong)(((uint)(&pCex[1].iPo)[(int)(uVar9 + lVar10) >> 5] >>
                        ((byte)(uVar9 + lVar10) & 0x1f) & 1) << 0x1e);
          lVar10 = lVar10 + 1;
          iVar6 = p->nRegs;
          pVVar12 = p->vCis;
          iVar8 = pVVar12->nSize;
        } while (lVar10 < iVar8 - iVar6);
        uVar9 = (ulong)(uint)((int)uVar9 + (int)lVar10);
      }
      iVar8 = (int)uVar9;
      if (0 < iVar6) {
        iVar13 = 0;
        do {
          iVar15 = p->vCos->nSize;
          uVar14 = (iVar15 - iVar6) + iVar13;
          if (((int)uVar14 < 0) || (iVar15 <= (int)uVar14)) goto LAB_006e22e2;
          iVar15 = p->vCos->pArray[uVar14];
          if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) goto LAB_006e22c3;
          pGVar1 = p->pObjs;
          pVVar12 = p->vCis;
          if (pGVar1 == (Gia_Obj_t *)0x0) goto LAB_006e20b1;
          uVar14 = (pVVar12->nSize - iVar6) + iVar13;
          if (((int)uVar14 < 0) || (pVVar12->nSize <= (int)uVar14)) goto LAB_006e22e2;
          lVar10 = (long)pVVar12->pArray[uVar14];
          if ((lVar10 < 0) || ((uint)p->nObjs <= (uint)pVVar12->pArray[uVar14])) goto LAB_006e22c3;
          *(ulong *)(pGVar1 + lVar10) =
               *(ulong *)(pGVar1 + lVar10) & 0xffffffffbfffffff |
               (ulong)((uint)*(undefined8 *)(pGVar1 + iVar15) & 0x40000000);
          iVar13 = iVar13 + 1;
          iVar6 = p->nRegs;
        } while (iVar13 < iVar6);
        pVVar12 = p->vCis;
      }
LAB_006e20b1:
      iVar6 = pVVar12->nSize;
      if (0 < iVar6) {
        piVar2 = pVVar12->pArray;
        lVar10 = 0;
        do {
          iVar13 = piVar2[lVar10];
          if (((long)iVar13 < 0) || (iVar15 = p->nObjs, iVar15 <= iVar13)) goto LAB_006e22c3;
          if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_006e2127;
          if ((p->pObjs[iVar13].field_0x3 & 0x40) != 0) {
            iVar6 = pAVar5->nPis * iVar7 + (int)lVar10;
            (&pAVar5[1].iPo)[iVar6 >> 5] = (&pAVar5[1].iPo)[iVar6 >> 5] | 1 << ((byte)iVar6 & 0x1f);
            iVar6 = pVVar12->nSize;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < iVar6);
      }
      iVar15 = p->nObjs;
      if (0 < iVar15) {
LAB_006e2127:
        lVar10 = 0;
        lVar16 = 0;
        do {
          pGVar1 = p->pObjs;
          if (pGVar1 == (Gia_Obj_t *)0x0) break;
          uVar3 = *(ulong *)(&pGVar1->field_0x0 + lVar10);
          if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar3) {
            *(ulong *)(&pGVar1->field_0x0 + lVar10) =
                 uVar3 & 0xffffffff3fffffff |
                 (ulong)((((uint)(uVar3 >> 0x3d) ^
                          *(uint *)((long)pGVar1 +
                                   (ulong)((uint)(uVar3 >> 0x1e) & 0x7ffffffc) * -3 + lVar10) >>
                          0x1e) & ((uint)(uVar3 >> 0x1d) & 7 ^
                                  *(uint *)((long)pGVar1 +
                                           (ulong)(uint)((int)(uVar3 & 0x1fffffff) << 2) * -3 +
                                           lVar10) >> 0x1e) & 1) << 0x1e);
            iVar15 = p->nObjs;
          }
          lVar16 = lVar16 + 1;
          lVar10 = lVar10 + 0xc;
        } while (lVar16 < iVar15);
      }
      pVVar12 = p->vCos;
      if (0 < pVVar12->nSize) {
        lVar10 = 0;
        do {
          iVar6 = pVVar12->pArray[lVar10];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_006e22c3;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar1 = p->pObjs + iVar6;
          uVar14 = (uint)*(ulong *)pGVar1;
          *(ulong *)pGVar1 =
               *(ulong *)pGVar1 & 0xffffffffbfffffff |
               (ulong)((uVar14 * 2 ^ *(uint *)(pGVar1 + -(ulong)(uVar14 & 0x1fffffff))) & 0x40000000
                      );
          lVar10 = lVar10 + 1;
          pVVar12 = p->vCos;
        } while (lVar10 < pVVar12->nSize);
      }
      bVar4 = iVar7 < pCex->iFrame;
      iVar7 = iVar7 + 1;
    } while (bVar4);
  }
  if (iVar8 != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCex.c"
                  ,0x150,
                  "Abc_Cex_t *Gia_ManCexExtendToIncludeCurrentStates(Gia_Man_t *, Abc_Cex_t *)");
  }
  uVar14 = pCex->iPo;
  iVar8 = p->vCos->nSize;
  if (iVar8 - p->nRegs <= (int)uVar14) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                  ,0x1d0,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if ((-1 < (int)uVar14) && ((int)uVar14 < iVar8)) {
    iVar8 = p->vCos->pArray[uVar14];
    if ((-1 < (long)iVar8) && (iVar8 < p->nObjs)) {
      if ((p->pObjs[iVar8].field_0x3 & 0x40) == 0) {
        __assert_fail("Gia_ManPo(p, pCex->iPo)->fMark0 == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCex.c"
                      ,0x151,
                      "Abc_Cex_t *Gia_ManCexExtendToIncludeCurrentStates(Gia_Man_t *, Abc_Cex_t *)")
        ;
      }
      Gia_ManCleanMark0(p);
      return pAVar5;
    }
LAB_006e22c3:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                  ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_006e22e2:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Abc_Cex_t * Gia_ManCexExtendToIncludeCurrentStates( Gia_Man_t * p, Abc_Cex_t * pCex )
{
    Abc_Cex_t * pNew;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int i, k, iBit = 0;
    assert( pCex->nRegs > 0 );
    // start the counter-example
    pNew = Abc_CexAlloc( 0, Gia_ManCiNum(p), pCex->iFrame + 1 );
    pNew->iFrame = pCex->iFrame;
    pNew->iPo    = pCex->iPo;
    // set const0
    Gia_ManConst0(p)->fMark0 = 0;
    // set init state
    Gia_ManForEachRi( p, pObjRi, k )
        pObjRi->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
    assert( iBit == pCex->nRegs );
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
        Gia_ManForEachCi( p, pObj, k )
            if ( pObj->fMark0 )
                Abc_InfoSetBit( pNew->pData, pNew->nPis * i + k );
        Gia_ManForEachAnd( p, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( p, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
    }
    assert( iBit == pCex->nBits );
    assert( Gia_ManPo(p, pCex->iPo)->fMark0 == 1 );
    Gia_ManCleanMark0(p);
    return pNew;
}